

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O3

int wallet::CalculateMaximumSignedInputSize
              (CTxOut *txout,COutPoint outpoint,SigningProvider *provider,bool can_grind_r,
              CCoinControl *coin_control)

{
  CScript *script;
  int iVar1;
  long in_FS_OFFSET;
  optional<long> oVar2;
  undefined1 local_a0 [112];
  char local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = -1;
  if (provider != (SigningProvider *)0x0) {
    script = (CScript *)local_a0;
    InferDescriptor(script,(SigningProvider *)&txout->scriptPubKey);
    if ((Descriptor *)local_a0._0_8_ != (Descriptor *)0x0) {
      local_30 = '\0';
      oVar2 = MaxInputWeight((Descriptor *)local_a0._0_8_,(optional<CTxIn> *)(local_a0 + 8),
                             coin_control,true,can_grind_r);
      if (local_30 == '\x01') {
        std::_Optional_payload_base<CTxIn>::_M_destroy
                  ((_Optional_payload_base<CTxIn> *)(local_a0 + 8));
      }
      if (((undefined1  [16])
           oVar2.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        script = (CScript *)
                 GetVirtualTransactionSize
                           (oVar2.super__Optional_base<long,_true,_true>._M_payload.
                            super__Optional_payload_base<long>._M_payload,0,0);
      }
      iVar1 = (int)script;
      if ((Descriptor *)local_a0._0_8_ != (Descriptor *)0x0) {
        (*(*(_func_int ***)local_a0._0_8_)[1])();
      }
      if (((undefined1  [16])
           oVar2.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) != (undefined1  [16])0x0)
      goto LAB_00bf157c;
    }
    iVar1 = -1;
  }
LAB_00bf157c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int CalculateMaximumSignedInputSize(const CTxOut& txout, const COutPoint outpoint, const SigningProvider* provider, bool can_grind_r, const CCoinControl* coin_control)
{
    if (!provider) return -1;

    if (const auto desc = InferDescriptor(txout.scriptPubKey, *provider)) {
        if (const auto weight = MaxInputWeight(*desc, {}, coin_control, true, can_grind_r)) {
            return static_cast<int>(GetVirtualTransactionSize(*weight, 0, 0));
        }
    }

    return -1;
}